

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O1

uint __thiscall FS::Focuser::stateError(Focuser *this)

{
  WifiDebugOstream log;
  WifiDebugOstream local_18;
  
  local_18.m_wifiDebug =
       (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t
       .super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
       super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl;
  local_18.m_serialDebug =
       (this->debugLog)._M_t.
       super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
       super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
       super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl;
  local_18.m_lastWasNewline = true;
  ::operator<<(&local_18,"hep hep hep error error error\n");
  return 10000000;
}

Assistant:

unsigned int Focuser::stateError()
{
  WifiDebugOstream log( debugLog.get(), net.get() );
  log << "hep hep hep error error error\n";
  return 10*1000*1000; // 10 sec pause 
}